

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O0

BN * gcdBinary(BN *__return_storage_ptr__,BN *a,BN *b)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  BN *bn;
  size_t local_30;
  size_t bcount;
  size_t acount;
  BN *b_local;
  BN *a_local;
  
  acount = (size_t)b;
  b_local = a;
  a_local = __return_storage_ptr__;
  bVar1 = BN::is0(a);
  if (bVar1) {
    BN::BN(__return_storage_ptr__,b);
  }
  else {
    bVar1 = BN::is0(b);
    if (bVar1) {
      BN::BN(__return_storage_ptr__,a);
    }
    else {
      bcount = BN::countzeroright(a);
      local_30 = BN::countzeroright(b);
      BN::operator>>=(a,bcount);
      BN::operator>>=(b,local_30);
      bVar1 = BN::operator<(a,b);
      if (bVar1) {
        std::swap<BN>(a,b);
      }
      while (bVar1 = BN::is0(a), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = BN::operator>=(a,b);
        if (bVar1) {
          BN::operator-=(a,b);
          sVar2 = BN::countzeroright(a);
          BN::operator>>=(a,sVar2);
        }
        else {
          BN::operator-=(b,a);
          sVar2 = BN::countzeroright(b);
          BN::operator>>=(b,sVar2);
        }
      }
      puVar3 = std::min<unsigned_long>(&bcount,&local_30);
      bn = BN::operator<<=(b,*puVar3);
      BN::BN(__return_storage_ptr__,bn);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN gcdBinary(BN a,BN b)
{
    if(a.is0())
        return b;

    if(b.is0())
        return a;

    size_t acount = a.countzeroright();
    size_t bcount = b.countzeroright();

    a >>= acount;
    b >>= bcount;

    // TODO why swap(a, b) is faster than a.swap(b) ?
    if(a < b)
        swap(a, b);

    while(!a.is0()) {
        if(a >= b) {
            a -= b;
            a >>= a.countzeroright();
        } else {
            b -= a;
            b >>= b.countzeroright();
        }
    }
    return move(b <<= min(acount,bcount));
}